

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xorfilter.h
# Opt level: O2

bool xor8_contain(uint64_t key,xor8_t *filter)

{
  uint8_t *puVar1;
  uint64_t uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar2 = xor_mix_split(key,filter->seed);
  iVar3 = (int)filter->blockLength;
  uVar4 = filter->blockLength & 0xffffffff;
  puVar1 = filter->fingerprints;
  return (byte)(puVar1[(uint)((int)(((uint)(uVar2 << 0x15) | (uint)(uVar2 >> 0x2b)) * uVar4 >> 0x20)
                             + iVar3)] ^ puVar1[(uVar2 & 0xffffffff) * uVar4 >> 0x20] ^
               puVar1[(uint)((int)((uVar2 >> 0x16 & 0xffffffff) * uVar4 >> 0x20) + iVar3 * 2)]) ==
         (byte)((byte)(uVar2 >> 0x20) ^ (byte)uVar2);
}

Assistant:

static inline bool xor8_contain(uint64_t key, const xor8_t *filter) {
  uint64_t hash = xor_mix_split(key, filter->seed);
  uint8_t f = xor_fingerprint(hash);
  uint32_t r0 = (uint32_t)hash;
  uint32_t r1 = (uint32_t)xor_rotl64(hash, 21);
  uint32_t r2 = (uint32_t)xor_rotl64(hash, 42);
  uint32_t h0 = xor_reduce(r0, filter->blockLength);
  uint32_t h1 = xor_reduce(r1, filter->blockLength) + filter->blockLength;
  uint32_t h2 = xor_reduce(r2, filter->blockLength) + 2 * filter->blockLength;
  return f == (filter->fingerprints[h0] ^ filter->fingerprints[h1] ^
       filter->fingerprints[h2]);
}